

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

void TestAlignmentForSize(int size)

{
  TestingPortal *pTVar1;
  ulong uVar2;
  void *pvVar3;
  char *pcVar4;
  int i;
  long lVar5;
  undefined8 uStack_350;
  void *pvStack_348;
  void *ptrs [100];
  
  pTVar1 = tcmalloc::TestingPortal::Get();
  uVar2 = (**(code **)(*(long *)pTVar1 + 0x18))(pTVar1);
  lVar5 = 0;
  printf("Testing alignment of malloc(%d)\n",(ulong)(uint)size);
  while( true ) {
    if (lVar5 == 100) {
      for (lVar5 = 0; lVar5 != 100; lVar5 = lVar5 + 1) {
        free(ptrs[lVar5 + -1]);
      }
      return;
    }
    pvVar3 = malloc((long)size);
    ptrs[lVar5 + -1] = pvVar3;
    if (((ulong)pvVar3 & 7) != 0) break;
    if ((uVar2 <= (ulong)(long)size) && ((ulong)pvVar3 % uVar2 != 0)) {
      pcVar4 = "Check failed: (p % min_align) == 0\n";
      uStack_350 = 0x23;
      goto LAB_0010d227;
    }
    lVar5 = lVar5 + 1;
  }
  pcVar4 = "Check failed: (p % sizeof(void*)) == 0\n";
  uStack_350 = 0x27;
LAB_0010d227:
  syscall(1,2,pcVar4,uStack_350);
  abort();
}

Assistant:

static void TestAlignmentForSize(int size) {
  const size_t min_align = TestingPortal::Get()->GetMinAlign();

  printf("Testing alignment of malloc(%d)\n", size);
  static const int kNum = 100;
  void* ptrs[kNum];
  for (int i = 0; i < kNum; i++) {
    ptrs[i] = malloc(size);
    uintptr_t p = reinterpret_cast<uintptr_t>(ptrs[i]);
    CHECK((p % sizeof(void*)) == 0);
    CHECK((p % sizeof(double)) == 0);

    // Must have 16-byte (or 8-byte in case of -DTCMALLOC_ALIGN_8BYTES)
    // alignment for large enough objects
    if (size >= min_align) {
      CHECK((p % min_align) == 0);
    }
  }
  for (int i = 0; i < kNum; i++) {
    free(ptrs[i]);
  }
}